

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_seq_cst.h
# Opt level: O1

ControlBlock * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::get_or_allocate_next_page
          (LFQueue_Tail<density::runtime_type<>,_density_tests::move_only_void_allocator,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,ControlBlock *i_end_control)

{
  PinResult PVar1;
  ControlBlock *pCVar2;
  ControlBlock *i_new_page;
  ulong uVar3;
  bool bVar4;
  PinGuard<density_tests::move_only_void_allocator,_(density::progress_guarantee)2> end_block;
  PinGuard<density_tests::move_only_void_allocator,_(density::progress_guarantee)2> local_38;
  
  if ((i_end_control == (ControlBlock *)0x0) ||
     ((ControlBlock *)((ulong)i_end_control | 0xffc0) != i_end_control ||
      ((ulong)i_end_control & 0x3f) != 0)) {
    density_tests::detail::assert_failed<>
              ("i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
               ,0x15c);
  }
  if (i_end_control == (ControlBlock *)0xffc0) {
    pCVar2 = create_initial_page(this,i_progress_guarantee);
    return pCVar2;
  }
  local_38.m_pinned_page = (void *)0x0;
  local_38.m_allocator = (move_only_void_allocator *)this;
  PVar1 = PinGuard<density_tests::move_only_void_allocator,_(density::progress_guarantee)2>::pin
                    (&local_38,i_end_control);
  if (PVar1 != PinFailed) {
    pCVar2 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
    if (pCVar2 != i_end_control) goto LAB_00e2b5ec;
    i_new_page = create_page(this,i_progress_guarantee);
    if (i_new_page != (ControlBlock *)0x0) {
      LOCK();
      uVar3 = i_end_control->m_next;
      bVar4 = uVar3 == 8;
      if (bVar4) {
        i_end_control->m_next = (uintptr_t)((long)&i_new_page->m_next + 2);
        uVar3 = 8;
      }
      UNLOCK();
      if (!bVar4) {
        discard_created_page(this,i_new_page);
        if (uVar3 == 0) goto LAB_00e2b5ec;
        i_new_page = (ControlBlock *)(uVar3 & 0xfffffffffffffff0);
        if (i_new_page == (ControlBlock *)0x0) {
          density_tests::detail::assert_failed<>
                    ("new_page != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_seq_cst.h"
                     ,0x18b);
        }
      }
      LOCK();
      pCVar2 = (ControlBlock *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar4 = i_end_control == pCVar2;
      if (bVar4) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = (__int_type)i_new_page;
        pCVar2 = i_end_control;
      }
      UNLOCK();
      if (bVar4) {
        pCVar2 = i_new_page;
      }
      goto LAB_00e2b5ec;
    }
  }
  pCVar2 = (ControlBlock *)0x0;
LAB_00e2b5ec:
  if (local_38.m_pinned_page != (void *)0x0) {
    PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(local_38.m_pinned_page);
  }
  return pCVar2;
}

Assistant:

ControlBlock * get_or_allocate_next_page(
              LfQueue_ProgressGuarantee i_progress_guarantee, ControlBlock * const i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != 0 && address_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != reinterpret_cast<ControlBlock *>(s_invalid_control_block))
                {
                    /* We are going to access the content of the end control, so we have to do a safe pin
                        (that is, pin the presumed tail, and then check if the tail has changed in the meanwhile). */
                    PinGuard<ALLOCATOR_TYPE, progress_lock_free> end_block(this);
                    auto const pin_result = end_block.pin(i_end_control);
                    if (pin_result == PinFailed)
                    {
                        return nullptr;
                    }
                    auto const updated_tail =
                      reinterpret_cast<ControlBlock *>(m_tail.load(mem_relaxed));
                    if (updated_tail != i_end_control)
                    {
                        return updated_tail;
                    }
                    // now the end control block is pinned, we can safely access it

                    // allocate and setup a new page
                    auto new_page = create_page(i_progress_guarantee);
                    if (new_page == nullptr)
                    {
                        return nullptr;
                    }

                    uintptr_t expected_next = LfQueue_InvalidNextPage;
                    if (!raw_atomic_compare_exchange_strong(
                          &i_end_control->m_next,
                          &expected_next,
                          reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead))
                    {
                        /* Some other thread has already linked a new page. We discard the page we
                            have just allocated. */
                        discard_created_page(new_page);

                        /* So i_end_control->m_next may now be the pointer to the next page
                            or 0 (if the page has been consumed in the meanwhile). */
                        if (expected_next == 0)
                        {
                            return updated_tail;
                        }

                        new_page =
                          reinterpret_cast<ControlBlock *>(expected_next & ~LfQueue_AllFlags);

                        DENSITY_ASSERT_INTERNAL(new_page != nullptr);
                        DENSITY_ASSUME_ALIGNED(new_page, ALLOCATOR_TYPE::page_alignment);
                    }

                    auto expected_tail = reinterpret_cast<uintptr_t>(i_end_control);
                    if (m_tail.compare_exchange_strong(
                          expected_tail, reinterpret_cast<uintptr_t>(new_page)))
                        return new_page;
                    else
                        return reinterpret_cast<ControlBlock *>(expected_tail);
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }